

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O3

GLuint gl3cts::TextureSizePromotion::Utilities::buildProgram
                 (Functions *gl,TestLog *log,GLchar *vertex_shader_source,
                 GLchar *fragment_shader_source)

{
  ostringstream *poVar1;
  GLint GVar2;
  bool bVar3;
  GLuint GVar4;
  GLenum GVar5;
  GLuint GVar6;
  GLuint *pGVar7;
  MessageBuilder *pMVar8;
  undefined4 *puVar9;
  GLuint *pGVar10;
  bool bVar11;
  GLchar **value;
  GLint status_1;
  GLint status;
  GLint log_size;
  GLchar *log_text_1;
  Shader shader [2];
  GLint local_204;
  undefined8 local_200;
  GLint local_1f4;
  TestLog *local_1f0;
  Enum<int,_2UL> local_1e8;
  GLchar *local_1d8;
  undefined8 local_1d0;
  GLchar *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  pGVar10 = (GLuint *)((long)&local_1d0 + 4);
  local_1d0 = 0x8b31;
  local_1c0 = 0x8b30;
  local_1f0 = log;
  local_1d8 = vertex_shader_source;
  local_1c8 = fragment_shader_source;
  GVar4 = (*gl->createProgram)();
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x56d);
  value = &local_1d8;
  bVar3 = true;
  do {
    bVar11 = bVar3;
    if (*value != (char *)0x0) {
      GVar6 = (*gl->createShader)(*(GLenum *)(value + 1));
      *(GLuint *)((long)value + 0xc) = GVar6;
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"glCreateShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                      ,0x577);
      (*gl->attachShader)(GVar4,*(GLuint *)((long)value + 0xc));
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"glAttachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                      ,0x57b);
      (*gl->shaderSource)(*(GLuint *)((long)value + 0xc),1,value,(GLint *)0x0);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"glShaderSource call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                      ,0x57f);
      (*gl->compileShader)(*(GLuint *)((long)value + 0xc));
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"glCompileShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                      ,0x583);
      local_204 = 0;
      (*gl->getShaderiv)(*(GLuint *)((long)value + 0xc),0x8b81,&local_204);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                      ,0x588);
      if (local_204 == 0) {
        local_1f4 = 0;
        (*gl->getShaderiv)(*(GLuint *)((long)value + 0xc),0x8b84,&local_1f4);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glGetShaderiv call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                        ,0x58e);
        GVar2 = local_1f4;
        local_200 = (GLchar *)operator_new__((long)local_1f4);
        (*gl->getShaderInfoLog)(*(GLuint *)((long)value + 0xc),GVar2,(GLsizei *)0x0,local_200);
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = local_1f0;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Shader compilation has failed.\n",0x1f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Shader type: ",0xd);
        local_1e8.m_value = *(int *)(value + 1);
        local_1e8.m_getName = glu::getShaderTypeName;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1e8,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Shader compilation error log:\n",0x1e);
        pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)&local_200);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                   "Shader source code:\n",0x14);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,value);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        if (local_200 != (GLchar *)0x0) {
          operator_delete__(local_200);
        }
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glGetShaderInfoLog call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                        ,0x59e);
        puVar9 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar9 = 0;
        __cxa_throw(puVar9,&int::typeinfo,0);
      }
    }
    value = &local_1c8;
    bVar3 = false;
  } while (bVar11);
  (*gl->linkProgram)(GVar4);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x5a7);
  local_200 = (GLchar *)((ulong)local_200._4_4_ << 0x20);
  (*gl->getProgramiv)(GVar4,0x8b82,(GLint *)&local_200);
  if ((int)local_200 == 1) {
    pGVar7 = pGVar10;
    bVar3 = true;
    do {
      bVar11 = bVar3;
      if (*pGVar7 != 0) {
        (*gl->detachShader)(GVar4,*pGVar7);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glDetachShader call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                        ,0x5b5);
      }
      pGVar7 = (GLuint *)((long)&local_1c0 + 4);
      bVar3 = false;
    } while (bVar11);
    bVar3 = true;
    do {
      bVar11 = bVar3;
      if (*pGVar10 != 0) {
        (*gl->deleteShader)(*pGVar10);
        *pGVar10 = 0;
      }
      pGVar10 = (GLuint *)((long)&local_1c0 + 4);
      bVar3 = false;
    } while (bVar11);
    return GVar4;
  }
  local_204 = 0;
  (*gl->getProgramiv)(GVar4,0x8b84,&local_204);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glGetProgramiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x5bf);
  GVar2 = local_204;
  local_1e8.m_getName = (GetNameFunc)operator_new__((long)local_204);
  (*gl->getProgramInfoLog)(GVar4,GVar2,(GLsizei *)0x0,(GLchar *)local_1e8.m_getName);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = local_1f0;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Program linkage has failed due to:\n",0x23);
  pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)&local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>
            (&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (local_1e8.m_getName != (GetNameFunc)0x0) {
    operator_delete__(local_1e8.m_getName);
  }
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glGetProgramInfoLog call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x5cb);
  puVar9 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar9 = 0;
  __cxa_throw(puVar9,&int::typeinfo,0);
}

Assistant:

glw::GLuint buildProgram(glw::Functions const& gl, tcu::TestLog& log, glw::GLchar const* const vertex_shader_source,
						 glw::GLchar const* const fragment_shader_source)
{
	glw::GLuint program = 0;

	struct Shader
	{
		glw::GLchar const* const source;
		glw::GLenum const		 type;
		glw::GLuint				 id;
	} shader[] = { { vertex_shader_source, GL_VERTEX_SHADER, 0 }, { fragment_shader_source, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	try
	{
		/* Create program. */
		program = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			if (DE_NULL != shader[i].source)
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(program, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, 1, &(shader[i].source), NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					glw::GLint log_size = 0;
					gl.getShaderiv(shader[i].id, GL_INFO_LOG_LENGTH, &log_size);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

					glw::GLchar* log_text = new glw::GLchar[log_size];

					gl.getShaderInfoLog(shader[i].id, log_size, NULL, &log_text[0]);

					log << tcu::TestLog::Message << "Shader compilation has failed.\n"
						<< "Shader type: " << glu::getShaderTypeStr(shader[i].type) << "\n"
						<< "Shader compilation error log:\n"
						<< log_text << "\n"
						<< "Shader source code:\n"
						<< shader[i].source << "\n"
						<< tcu::TestLog::EndMessage;

					delete[] log_text;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog call failed.");

					throw 0;
				}
			}
		}

		/* Link. */
		gl.linkProgram(program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(program, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(program, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			glw::GLint log_size = 0;

			gl.getProgramiv(program, GL_INFO_LOG_LENGTH, &log_size);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

			glw::GLchar* log_text = new glw::GLchar[log_size];

			gl.getProgramInfoLog(program, log_size, NULL, &log_text[0]);

			log << tcu::TestLog::Message << "Program linkage has failed due to:\n"
				<< log_text << "\n"
				<< tcu::TestLog::EndMessage;

			delete[] log_text;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

			throw 0;
		}
	}
	catch (...)
	{
		if (program)
		{
			gl.deleteProgram(program);

			program = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	return program;
}